

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall
QComboBoxPrivate::dataChanged(QComboBoxPrivate *this,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  int iVar1;
  int iVar2;
  int iVar3;
  QComboBoxPrivate *this_00;
  QComboBoxPrivate *in_RDX;
  QModelIndex *in_RSI;
  QComboBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  QComboBox *q;
  QString text;
  QAccessibleValueChangeEvent event;
  QWidget *in_stack_ffffffffffffff18;
  QComboBoxPrivate *in_stack_ffffffffffffff20;
  bool local_c1;
  int index;
  QComboBoxPrivate *this_01;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  QSize local_88;
  QVariant local_68;
  QAccessibleValueChangeEvent local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = (QComboBoxPrivate *)q_func(in_RDI);
  local_c1 = true;
  if (((byte)in_RDI->field_0x34c >> 3 & 1) == 0) {
    QModelIndex::parent((QModelIndex *)in_RDI);
    local_c1 = ::operator!=((QModelIndex *)in_stack_ffffffffffffff20,
                            (QPersistentModelIndex *)in_stack_ffffffffffffff18);
  }
  if (local_c1 == false) {
    if (in_RDI->sizeAdjustPolicy == AdjustToContents) {
      QSize::QSize((QSize *)in_stack_ffffffffffffff20);
      in_RDI->sizeHint = local_88;
      adjustComboBoxSize(in_stack_ffffffffffffff20);
      QWidget::updateGeometry((QWidget *)in_stack_ffffffffffffff20);
    }
    iVar1 = QPersistentModelIndex::row();
    iVar2 = QModelIndex::row(in_RSI);
    index = (int)((ulong)in_RSI >> 0x20);
    if (iVar2 <= iVar1) {
      iVar2 = QPersistentModelIndex::row();
      iVar3 = QModelIndex::row((QModelIndex *)in_RDX);
      if (iVar2 <= iVar3) {
        local_a0 = &DAT_aaaaaaaaaaaaaaaa;
        local_98 = &DAT_aaaaaaaaaaaaaaaa;
        local_90 = &DAT_aaaaaaaaaaaaaaaa;
        QPersistentModelIndex::row();
        QComboBox::itemText((QComboBox *)this_01,index);
        if (in_RDI->lineEdit == (QLineEdit *)0x0) {
          updateCurrentText(this_00,(QString *)in_stack_ffffffffffffff18);
        }
        else {
          QLineEdit::setText((QLineEdit *)this_00,(QString *)in_stack_ffffffffffffff18);
          updateLineEditGeometry(in_RDX);
        }
        QWidget::update(in_stack_ffffffffffffff18);
        memset(local_48,0xaa,0x40);
        ::QVariant::QVariant(&local_68,(QString *)&local_a0);
        QAccessibleValueChangeEvent::QAccessibleValueChangeEvent
                  ((QAccessibleValueChangeEvent *)in_RDI,(QObject *)CONCAT44(iVar1,iVar2),
                   (QVariant *)this_00);
        ::QVariant::~QVariant(&local_68);
        QAccessible::updateAccessibility((QAccessibleEvent *)local_48);
        QAccessibleValueChangeEvent::~QAccessibleValueChangeEvent(local_48);
        QString::~QString((QString *)0x535f4e);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBoxPrivate::dataChanged(const QModelIndex &topLeft, const QModelIndex &bottomRight)
{
    Q_Q(QComboBox);
    if (inserting || topLeft.parent() != root)
        return;

    if (sizeAdjustPolicy == QComboBox::AdjustToContents) {
        sizeHint = QSize();
        adjustComboBoxSize();
        q->updateGeometry();
    }

    if (currentIndex.row() >= topLeft.row() && currentIndex.row() <= bottomRight.row()) {
        const QString text = q->itemText(currentIndex.row());
        if (lineEdit) {
            lineEdit->setText(text);
            updateLineEditGeometry();
        } else {
            updateCurrentText(text);
        }
        q->update();
#if QT_CONFIG(accessibility)
        QAccessibleValueChangeEvent event(q, text);
        QAccessible::updateAccessibility(&event);
#endif
    }
}